

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O1

void __thiscall QGroupBox::mouseMoveEvent(QGroupBox *this,QMouseEvent *event)

{
  char cVar1;
  long lVar2;
  QRect QVar3;
  QRect QVar4;
  QRect QVar5;
  undefined4 uVar6;
  uint uVar7;
  int iVar8;
  QStyle *pQVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  bool bVar11;
  double extraout_XMM0_Qa;
  undefined1 auVar12 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar13 [16];
  QStyleOptionGroupBox box;
  QRect local_c8;
  QStyleOptionGroupBox local_b8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  memset(&local_b8,0xaa,0x88);
  QStyleOptionGroupBox::QStyleOptionGroupBox(&local_b8);
  (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&local_b8);
  pQVar9 = QWidget::style(&this->super_QWidget);
  uVar6 = QEventPoint::position();
  auVar13._0_8_ =
       (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM1_Qa;
  auVar13._8_8_ =
       (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM0_Qa;
  auVar13 = minpd(_DAT_0066f5d0,auVar13);
  auVar12._8_8_ = -(ulong)(-2147483648.0 < auVar13._8_8_);
  auVar12._0_8_ = -(ulong)(-2147483648.0 < auVar13._0_8_);
  uVar7 = movmskpd(uVar6,auVar12);
  uVar10 = 0x8000000000000000;
  if ((uVar7 & 1) != 0) {
    uVar10 = (ulong)(uint)(int)auVar13._0_8_ << 0x20;
  }
  local_c8._0_8_ = 0x80000000;
  if ((uVar7 & 2) != 0) {
    local_c8._0_8_ = (ulong)(uint)(int)auVar13._8_8_;
  }
  local_c8._0_8_ = local_c8._0_8_ | uVar10;
  iVar8 = (**(code **)(*(long *)pQVar9 + 0xd0))(pQVar9,7,&local_b8,&local_c8,this);
  QVar5.x2.m_i = local_c8.x2.m_i;
  QVar5.y2.m_i = local_c8.y2.m_i;
  QVar5.x1.m_i = local_c8.x1.m_i;
  QVar5.y1.m_i = local_c8.y1.m_i;
  QVar4.x2.m_i = local_c8.x2.m_i;
  QVar4.y2.m_i = local_c8.y2.m_i;
  QVar4.x1.m_i = local_c8.x1.m_i;
  QVar4.y1.m_i = local_c8.y1.m_i;
  QVar3.x2.m_i = local_c8.x2.m_i;
  QVar3.y2.m_i = local_c8.y2.m_i;
  QVar3.x1.m_i = local_c8.x1.m_i;
  QVar3.y1.m_i = local_c8.y1.m_i;
  cVar1 = *(char *)(lVar2 + 0x27c);
  bVar11 = iVar8 - 1U < 2;
  *(bool *)(lVar2 + 0x27c) = bVar11;
  if (((*(char *)(lVar2 + 0x279) == '\x01') && (QVar3 = QVar4, (bool)cVar1 != bVar11)) &&
     (QVar3 = QVar5, 0xfffffffd < *(int *)(lVar2 + 0x280) - 3U)) {
    pQVar9 = QWidget::style(&this->super_QWidget);
    local_c8 = (QRect)(**(code **)(*(long *)pQVar9 + 0xd8))(pQVar9,7,&local_b8,1,this);
    QWidget::update(&this->super_QWidget,&local_c8);
    QVar3 = local_c8;
  }
  event[0xc] = (QMouseEvent)0x0;
  local_c8 = QVar3;
  if (&(local_b8.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGroupBox::mouseMoveEvent(QMouseEvent *event)
{
    Q_D(QGroupBox);
    QStyleOptionGroupBox box;
    initStyleOption(&box);
    QStyle::SubControl pressed = style()->hitTestComplexControl(QStyle::CC_GroupBox, &box,
                                                                event->position().toPoint(), this);
    bool oldOverCheckBox = d->overCheckBox;
    d->overCheckBox = (pressed == QStyle::SC_GroupBoxCheckBox || pressed == QStyle::SC_GroupBoxLabel);
    if (d->checkable && (d->pressedControl == QStyle::SC_GroupBoxCheckBox || d->pressedControl == QStyle::SC_GroupBoxLabel)
        && (d->overCheckBox != oldOverCheckBox))
        update(style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this));

    event->ignore();
}